

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_convolve_2d_facade
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams **interp_filters,int subpel_x_qn,int x_step_q4,int subpel_y_qn,
               int y_step_q4,int scaled,ConvolveParams *conv_params)

{
  ConvolveParams *conv_params_00;
  uint8_t *src_00;
  int unaff_EBX;
  InterpFilterParams *unaff_RBP;
  undefined4 in_ESI;
  InterpFilterParams *in_RDI;
  undefined4 in_R9D;
  int unaff_R14D;
  ConvolveParams *unaff_R15;
  int unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000024;
  int in_stack_00000030;
  long in_stack_00000038;
  InterpFilterParams *filter_params_y;
  InterpFilterParams *filter_params_x;
  int in_stack_00008aa4;
  int in_stack_00008aa8;
  int in_stack_00008aac;
  uint8_t *in_stack_00008ab0;
  int in_stack_00008abc;
  uint8_t *in_stack_00008ac0;
  InterpFilterParams *in_stack_00008ad0;
  InterpFilterParams *in_stack_00008ad8;
  int in_stack_00008ae0;
  int in_stack_00008ae8;
  ConvolveParams *in_stack_00008af0;
  undefined8 in_stack_ffffffffffffff70;
  int h_00;
  undefined8 in_stack_ffffffffffffff78;
  int h_01;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  int src_stride_00;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  uint8_t *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd0;
  
  conv_params_00 = *(ConvolveParams **)CONCAT44(in_stack_0000000c,in_stack_00000008);
  src_00 = *(uint8_t **)(CONCAT44(in_stack_0000000c,in_stack_00000008) + 8);
  src_stride_00 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  h_01 = (int)((ulong)in_stack_00000038 >> 0x20);
  if ((*(short *)&conv_params_00->dst == 2) || (*(short *)(src_00 + 8) == 2)) {
    if ((in_stack_00000010 != 0) && (in_stack_00000020 != 0)) {
      av1_convolve_2d_sr_intrabc_c
                (in_stack_00008ac0,in_stack_00008abc,in_stack_00008ab0,in_stack_00008aac,
                 in_stack_00008aa8,in_stack_00008aa4,in_stack_00008ad0,in_stack_00008ad8,
                 in_stack_00008ae0,in_stack_00008ae8,in_stack_00008af0);
      return;
    }
    h_00 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    if (in_stack_00000010 != 0) {
      av1_convolve_x_sr_intrabc_c
                ((uint8_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 src_stride_00,
                 (uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),h_01,
                 (int)in_stack_00000038,h_00,
                 (InterpFilterParams *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                 ,(int)src_00,conv_params_00);
      return;
    }
    if (in_stack_00000020 != 0) {
      av1_convolve_y_sr_intrabc_c
                ((uint8_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 src_stride_00,
                 (uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78,h_00
                 ,(InterpFilterParams *)
                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),(int)src_00);
      return;
    }
  }
  if (in_stack_00000030 == 0) {
    if (*(int *)(in_stack_00000038 + 0x20) == 0) {
      convolve_2d_facade_single
                (src_00,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,h_01,
                 (InterpFilterParams *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),in_RDI,unaff_EBX,
                 unaff_R14D,unaff_R15);
    }
    else {
      convolve_2d_facade_compound
                (src_00,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,h_01,
                 (InterpFilterParams *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),in_RDI,unaff_EBX,
                 unaff_R14D,unaff_R15);
    }
  }
  else {
    convolve_2d_scale_wrapper
              ((uint8_t *)CONCAT44(in_R9D,in_stack_ffffffffffffffb8),
               (int)((ulong)conv_params_00 >> 0x20),src_00,in_stack_ffffffffffffffa4,
               in_stack_ffffffffffffffa0,h_01,(InterpFilterParams *)unaff_R15,unaff_RBP,
               unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
               (ConvolveParams *)CONCAT44(in_stack_00000024,in_stack_00000020));
  }
  return;
}

Assistant:

void av1_convolve_2d_facade(const uint8_t *src, int src_stride, uint8_t *dst,
                            int dst_stride, int w, int h,
                            const InterpFilterParams *interp_filters[2],
                            const int subpel_x_qn, int x_step_q4,
                            const int subpel_y_qn, int y_step_q4, int scaled,
                            ConvolveParams *conv_params) {
  (void)x_step_q4;
  (void)y_step_q4;
  (void)dst;
  (void)dst_stride;

  const InterpFilterParams *filter_params_x = interp_filters[0];
  const InterpFilterParams *filter_params_y = interp_filters[1];

  // TODO(jingning, yunqing): Add SIMD support to 2-tap filter case.
  // 2-tap filter indicates that it is for IntraBC.
  if (filter_params_x->taps == 2 || filter_params_y->taps == 2) {
    assert(filter_params_x->taps == 2 && filter_params_y->taps == 2);
    assert(!scaled);
    if (subpel_x_qn && subpel_y_qn) {
      av1_convolve_2d_sr_intrabc(src, src_stride, dst, dst_stride, w, h,
                                 filter_params_x, filter_params_y, subpel_x_qn,
                                 subpel_y_qn, conv_params);
      return;
    } else if (subpel_x_qn) {
      av1_convolve_x_sr_intrabc(src, src_stride, dst, dst_stride, w, h,
                                filter_params_x, subpel_x_qn, conv_params);
      return;
    } else if (subpel_y_qn) {
      av1_convolve_y_sr_intrabc(src, src_stride, dst, dst_stride, w, h,
                                filter_params_y, subpel_y_qn);
      return;
    }
  }

  if (scaled) {
    convolve_2d_scale_wrapper(src, src_stride, dst, dst_stride, w, h,
                              filter_params_x, filter_params_y, subpel_x_qn,
                              x_step_q4, subpel_y_qn, y_step_q4, conv_params);
  } else if (conv_params->is_compound) {
    convolve_2d_facade_compound(src, src_stride, dst, dst_stride, w, h,
                                filter_params_x, filter_params_y, subpel_x_qn,
                                subpel_y_qn, conv_params);
  } else {
    convolve_2d_facade_single(src, src_stride, dst, dst_stride, w, h,
                              filter_params_x, filter_params_y, subpel_x_qn,
                              subpel_y_qn, conv_params);
  }
}